

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O3

Term * Kernel::SubstHelper::
       applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                 (Term *trm,Substitution *applicator,bool noSharing)

{
  Term ***pppTVar1;
  TermList ***pppTVar2;
  uint uVar3;
  TermList **ppTVar4;
  Self SVar5;
  Self SVar6;
  size_t sVar7;
  Self SVar8;
  uint uVar9;
  int iVar10;
  Term *pTVar11;
  TermList TVar12;
  Term *pTVar13;
  TermList *pTVar14;
  Term **ppTVar15;
  bool *pbVar16;
  TermList **ppTVar17;
  Formula *formula;
  long lVar18;
  Literal *lit;
  ulong uVar19;
  ulong uVar20;
  _Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false> this;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_78;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_68;
  DArray<Kernel::TermList> local_58;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_40;
  
  uVar9 = trm->_functor;
  if (0xfffffff8 < uVar9) {
    uVar3 = (&switchD_0031532b::switchdataD_008d4cb0)[~uVar9];
    switch(uVar9) {
    case 0xfffffffa:
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_78);
      Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
                (&local_68);
      Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_40);
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_58);
      _Unwind_Resume((long)&switchD_0031532b::switchdataD_008d4cb0 + (long)(int)uVar3);
    case 0xfffffffb:
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar13 = (Term *)(*(code *)(&DAT_008d4ce8 +
                                  *(int *)(&DAT_008d4ce8 + (ulong)~trm->_functor * 4)))();
      return pTVar13;
    case 0xfffffffc:
      pTVar13 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                          (*(Term **)&trm[-1]._functor,applicator,noSharing);
      pTVar13 = Term::createTuple(pTVar13);
      return pTVar13;
    case 0xfffffffd:
      formula = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                          (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      pTVar13 = Term::createFormula(formula);
      return pTVar13;
    case 0xfffffffe:
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar13 = (Term *)(*(code *)(&DAT_008d4d04 +
                                  *(int *)(&DAT_008d4d04 + (ulong)~trm->_functor * 4)))();
      return pTVar13;
    case 0xffffffff:
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                ((TermList)trm->_args[(ulong)(*(uint *)&trm->field_0xc & 0xfffffff) - 1]._content,
                 applicator,noSharing);
      pTVar13 = (Term *)(*(code *)(&DAT_008d4d20 +
                                  *(int *)(&DAT_008d4d20 + (ulong)~trm->_functor * 4)))();
      return pTVar13;
    }
    Lib::DArray<Kernel::TermList>::DArray(&local_58,(ulong)(*(uint *)&trm->field_0xc & 0xfffffff));
    uVar9 = *(uint *)&trm->field_0xc & 0xfffffff;
    uVar19 = (ulong)uVar9;
    if (uVar9 != 0) {
      lVar18 = 0;
      uVar20 = 0;
      do {
        TVar12 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                           (trm->_args[uVar19 + lVar18]._content,applicator,noSharing);
        local_58._array[uVar20]._content = TVar12._content;
        uVar20 = uVar20 + 1;
        uVar19 = (ulong)(*(uint *)&trm->field_0xc & 0xfffffff);
        lVar18 = lVar18 + -1;
      } while (uVar20 < uVar19);
    }
    pTVar13 = (Term *)(*(code *)(&DAT_008d4ccc + *(int *)(&DAT_008d4ccc + (ulong)~trm->_functor * 4)
                                ))();
    return pTVar13;
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_58);
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_40);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled(&local_68);
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_78);
  SVar6._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
  super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
       local_68._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
       super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl;
  pbVar16 = *(bool **)((long)local_68._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                             .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10);
  if (pbVar16 ==
      *(bool **)((long)local_68._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18)) {
    Lib::Stack<bool>::expand
              ((Stack<bool> *)
               local_68._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t
               .super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
               super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
    pbVar16 = *(bool **)((long)SVar6._M_t.
                               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                               .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10
                        );
  }
  sVar7 = local_58._size;
  *pbVar16 = false;
  *(bool **)((long)SVar6._M_t.
                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
       pbVar16 + 1;
  uVar9 = *(uint *)&trm->field_0xc;
  ppTVar17 = *(TermList ***)(local_58._size + 0x10);
  if (ppTVar17 == *(TermList ***)(local_58._size + 0x18)) {
    Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_58._size);
    ppTVar17 = *(TermList ***)(sVar7 + 0x10);
  }
  *ppTVar17 = trm->_args + (uVar9 & 0xfffffff);
  pppTVar2 = (TermList ***)(sVar7 + 0x10);
  *pppTVar2 = *pppTVar2 + 1;
LAB_00315426:
  while( true ) {
    sVar7 = local_58._size;
    this._M_head_impl = (Stack<Kernel::TermList> *)local_78._self;
    ppTVar4 = *(TermList ***)(local_58._size + 0x10);
    ppTVar17 = ppTVar4 + -1;
    *(TermList ***)(local_58._size + 0x10) = ppTVar17;
    pTVar14 = ppTVar4[-1];
    pTVar13 = (Term *)pTVar14->_content;
    if (((uint)pTVar13 & 3) == 2) break;
    if (ppTVar17 == *(TermList ***)(local_58._size + 0x18)) {
      Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_58._size);
      ppTVar17 = *(TermList ***)(sVar7 + 0x10);
      pTVar13 = (Term *)pTVar14->_content;
    }
    SVar8._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>,_true,_true>
            )local_40._self;
    this._M_head_impl = (Stack<Kernel::TermList> *)local_78._self;
    *ppTVar17 = pTVar14 + -1;
    pppTVar2 = (TermList ***)(sVar7 + 0x10);
    *pppTVar2 = *pppTVar2 + 1;
    uVar9 = (uint)pTVar13 & 3;
    if (uVar9 == 3) {
      pTVar14 = *(TermList **)
                 ((long)local_78._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
      if (pTVar14 ==
          *(TermList **)
           ((long)local_78._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18)
         ) {
        Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_78._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
        pTVar14 = *(TermList **)((long)this._M_head_impl + 0x10);
      }
      TVar12._content = (uint64_t)((uint)pTVar13 | 3);
      pTVar14->_content = TVar12._content;
      *(TermList **)((long)this._M_head_impl + 0x10) = pTVar14 + 1;
joined_r0x003155b0:
      if ((Term *)TVar12._content != pTVar13) goto LAB_00315679;
    }
    else {
      if (uVar9 == 1) {
        TVar12 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::
                 derefQueryBinding(applicator->_parent,(uint)((ulong)pTVar13 >> 2));
        TVar12 = Renaming::apply(applicator->_resultDenormalizer,TVar12);
        SVar5._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
             local_78._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl;
        pTVar14 = *(TermList **)
                   ((long)local_78._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10);
        if (pTVar14 ==
            *(TermList **)
             ((long)local_78._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::TermList>::expand
                    ((Stack<Kernel::TermList> *)
                     local_78._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
          pTVar14 = *(TermList **)
                     ((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>.
                            _M_head_impl + 0x10);
        }
        pTVar14->_content = TVar12._content;
        *(TermList **)
         ((long)SVar5._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
             pTVar14 + 1;
        goto joined_r0x003155b0;
      }
      if (((ulong)pTVar13 & 1) == 0) {
        if ((pTVar13->_args[0]._content & 8) != 0) {
          pTVar11 = pTVar13;
          if (*(int *)&pTVar13->field_0xc < 0) {
            iVar10 = 0;
            do {
              pTVar11 = *(Term **)&(pTVar11->field_9)._vars;
              if (((ulong)pTVar11 & 1) != 0) {
                uVar9 = 3;
                goto LAB_003156a9;
              }
              iVar10 = iVar10 + 2;
            } while (*(int *)&pTVar11->field_0xc < 0);
          }
          else {
            iVar10 = 0;
          }
          uVar9 = (pTVar11->field_9)._vars;
LAB_003156a9:
          if (iVar10 + uVar9 == 0) goto LAB_003156ad;
        }
        if (0xfffffff8 < pTVar13->_functor) {
          pTVar13 = applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::Substitution>
                              (pTVar13,applicator,noSharing);
          pTVar14 = *(TermList **)((long)this._M_head_impl + 0x10);
          if (pTVar14 == *(TermList **)((long)this._M_head_impl + 0x18)) {
            Lib::Stack<Kernel::TermList>::expand(this._M_head_impl);
            goto LAB_003156f7;
          }
          goto LAB_003156fb;
        }
        ppTVar15 = *(Term ***)
                    ((long)local_40._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl
                    + 0x10);
        if (ppTVar15 ==
            *(Term ***)
             ((long)local_40._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x18)
           ) {
          Lib::Stack<Kernel::Term_*>::expand
                    ((Stack<Kernel::Term_*> *)
                     local_40._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl);
          ppTVar15 = *(Term ***)
                      ((long)SVar8._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>.
                             _M_head_impl + 0x10);
        }
        SVar6._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
        _M_t.super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
        super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
             local_68._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
             super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl;
        *ppTVar15 = pTVar13;
        pppTVar1 = (Term ***)
                   ((long)SVar8._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
                   0x10);
        *pppTVar1 = *pppTVar1 + 1;
        pbVar16 = *(bool **)((long)local_68._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl +
                            0x10);
        if (pbVar16 ==
            *(bool **)((long)local_68._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                             .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18))
        {
          Lib::Stack<bool>::expand
                    ((Stack<bool> *)
                     local_68._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
          pbVar16 = *(bool **)((long)SVar6._M_t.
                                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl
                              + 0x10);
        }
        sVar7 = local_58._size;
        *pbVar16 = false;
        *(bool **)((long)SVar6._M_t.
                         super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                         .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
             pbVar16 + 1;
        uVar9 = *(uint *)&pTVar13->field_0xc;
        ppTVar17 = *(TermList ***)(local_58._size + 0x10);
        if (ppTVar17 == *(TermList ***)(local_58._size + 0x18)) {
          Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_58._size);
          ppTVar17 = *(TermList ***)(sVar7 + 0x10);
        }
        *ppTVar17 = pTVar13->_args + (uVar9 & 0xfffffff);
        pppTVar2 = (TermList ***)(sVar7 + 0x10);
        *pppTVar2 = *pppTVar2 + 1;
      }
      else {
LAB_003156ad:
        pTVar14 = *(TermList **)
                   ((long)local_78._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10);
        if (pTVar14 ==
            *(TermList **)
             ((long)local_78._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::TermList>::expand
                    ((Stack<Kernel::TermList> *)
                     local_78._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
LAB_003156f7:
          pTVar14 = (this._M_head_impl)->_cursor;
        }
LAB_003156fb:
        pTVar14->_content = (uint64_t)pTVar13;
        *(TermList **)((long)this._M_head_impl + 0x10) = pTVar14 + 1;
      }
    }
  }
  ppTVar15 = *(Term ***)
              ((long)local_40._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10
              );
  if (ppTVar15 !=
      *(Term ***)
       ((long)local_40._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 8)) {
    *(Term ***)
     ((long)local_40._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) =
         ppTVar15 + -1;
    pTVar13 = ppTVar15[-1];
    pbVar16 = *(bool **)((long)local_68._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                               .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10
                        );
    *(bool **)((long)local_68._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
         pbVar16 + -1;
    if (pbVar16[-1] == false) {
      pTVar14 = *(TermList **)
                 ((long)local_78._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 8) + (((ulong)((long)*(TermList **)
                                       ((long)local_78._self._M_t.
                                              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              .
                                              super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                              ._M_head_impl + 0x10) -
                               (long)*(TermList **)
                                      ((long)local_78._self._M_t.
                                             super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             .
                                             super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                             ._M_head_impl + 8)) >> 3) -
                      (ulong)(*(uint *)&pTVar13->field_0xc & 0xfffffff));
      *(TermList **)
       ((long)local_78._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar14;
      if (pTVar14 ==
          *(TermList **)
           ((long)local_78._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18)
         ) {
        Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_78._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
        goto LAB_003156f7;
      }
      goto LAB_003156fb;
    }
    uVar9 = *(uint *)&pTVar13->field_0xc & 0xfffffff;
    pTVar14 = *(TermList **)
               ((long)local_78._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10) + (-1 - (ulong)(uVar9 - 1));
    if (noSharing) {
LAB_003154ae:
      pTVar11 = Term::createNonShared(pTVar13,pTVar14);
    }
    else {
      if (uVar9 != 0) {
        lVar18 = 0;
        do {
          uVar19 = pTVar14[lVar18]._content & 3;
          if (uVar19 == 0) {
            if ((*(byte *)(pTVar14[lVar18]._content + 0x28) & 8) == 0) goto LAB_003154ae;
          }
          else if ((int)uVar19 == 3) goto LAB_003154ae;
          lVar18 = lVar18 + 1;
        } while (uVar9 != (uint)lVar18);
      }
      if ((pTVar13->_args[0]._content & 0x20) == 0) {
        pTVar11 = Term::create(pTVar13,pTVar14);
      }
      else {
        pTVar11 = &AtomicSort::create((AtomicSort *)pTVar13,pTVar14)->super_Term;
      }
    }
    SVar5._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
         local_78._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl;
    pTVar14 = *(TermList **)
               ((long)local_78._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 8
               ) + (((ulong)((long)*(TermList **)
                                    ((long)local_78._self._M_t.
                                           super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                           .
                                           super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                           ._M_head_impl + 0x10) -
                            (long)*(TermList **)
                                   ((long)local_78._self._M_t.
                                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                          .
                                          super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                          ._M_head_impl + 8)) >> 3) -
                   (ulong)(*(uint *)&pTVar13->field_0xc & 0xfffffff));
    *(TermList **)
     ((long)local_78._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
         pTVar14;
    if (pTVar14 ==
        *(TermList **)
         ((long)local_78._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::TermList>::expand
                ((Stack<Kernel::TermList> *)
                 local_78._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      pTVar14 = *(TermList **)
                 ((long)SVar5._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
    }
    pTVar14->_content = (uint64_t)pTVar11;
    *(TermList **)
     ((long)SVar5._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
         pTVar14 + 1;
LAB_00315679:
    (*(bool **)((long)local_68._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                      .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10))[-1] =
         true;
    goto LAB_00315426;
  }
  pbVar16 = *(bool **)((long)local_68._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                             .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10);
  *(bool **)((long)local_68._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
       pbVar16 + -1;
  if (pbVar16[-1] == true) {
    uVar9 = *(uint *)&trm->field_0xc & 0xfffffff;
    pTVar14 = *(TermList **)
               ((long)local_78._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10) + (-1 - (ulong)(uVar9 - 1));
    uVar19 = trm->_args[0]._content;
    if ((uVar19 & 0x10) == 0) {
      if ((uVar19 & 0x20) == 0) {
        if (noSharing) {
LAB_003157ee:
          trm = Term::createNonShared(trm,pTVar14);
        }
        else {
          if (uVar9 != 0) {
            lVar18 = 0;
            do {
              uVar19 = pTVar14[lVar18]._content & 3;
              if (uVar19 == 0) {
                if ((*(byte *)(pTVar14[lVar18]._content + 0x28) & 8) == 0) goto LAB_003157ee;
              }
              else if ((int)uVar19 == 3) goto LAB_003157ee;
              lVar18 = lVar18 + 1;
            } while (uVar9 != (uint)lVar18);
          }
          trm = Term::create(trm,pTVar14);
        }
      }
      else {
        trm = &AtomicSort::create((AtomicSort *)trm,pTVar14)->super_Term;
      }
    }
    else {
      trm = &Literal::create((Literal *)trm,pTVar14)->super_Term;
    }
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_78);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled(&local_68)
  ;
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (&local_40);
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
            )&local_58);
  return trm;
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}